

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Arg * __thiscall
fmt::internal::FormatterBase::do_get_arg(FormatterBase *this,uint arg_index,char **error)

{
  LongLong *pLVar1;
  undefined8 *in_RCX;
  Arg *in_RDI;
  Arg *arg;
  
  ArgList::operator[](&this->args_,arg_index);
  if (in_RDI->type == NONE) {
    *in_RCX = "argument index out of range";
  }
  else if (in_RDI->type == NAMED_ARG) {
    pLVar1 = (LongLong *)(in_RDI->super_Value).field_0.pointer;
    (in_RDI->super_Value).field_0.long_long_value = *pLVar1;
    (in_RDI->super_Value).field_0.string.size = pLVar1[1];
    in_RDI->type = *(Type *)(pLVar1 + 2);
  }
  return in_RDI;
}

Assistant:

FMT_FUNC Arg fmt::internal::FormatterBase::do_get_arg(
    unsigned arg_index, const char *&error) {
  Arg arg = args_[arg_index];
  switch (arg.type) {
  case Arg::NONE:
    error = "argument index out of range";
    break;
  case Arg::NAMED_ARG:
    arg = *static_cast<const internal::Arg*>(arg.pointer);
    break;
  default:
    /*nothing*/;
  }
  return arg;
}